

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void MiniScript::UnitTest::DeleteAllTests(void)

{
  undefined8 local_18;
  UnitTest *test;
  UnitTest *next;
  
  for (local_18 = cTests; local_18 != 0; local_18 = *(long *)(local_18 + 0x10)) {
  }
  cTests = 0;
  return;
}

Assistant:

void UnitTest::DeleteAllTests()
	{
		UnitTest *next;
		for (UnitTest *test = cTests; test; test = next) {
			next = test->mNext;
			// Jul 06 2001 -- JJS (1) -- commented out:
			//delete test;
		}
		cTests = 0;
	}